

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CAssignSubscriptStm *statement)

{
  CIdExp *pCVar1;
  IExpression *pIVar2;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var3;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var4;
  CMemExpression *pCVar5;
  CMoveStatement *pCVar6;
  int _value;
  ISubtreeWrapper *_wrapper;
  CBinopExpression *this_00;
  CBinopExpression *pCVar7;
  CConstExpression *pCVar8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_a0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_98;
  CExpression *local_90;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_68;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  CBinopExpression *local_48;
  CMemExpression *local_40;
  CMoveStatement *local_38;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CAssignSubscriptStm\n");
  pCVar1 = (statement->idExpression)._M_t.
           super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_50);
  _Var3._M_head_impl = local_50._M_head_impl;
  pIVar2 = (statement->indexExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_50);
  _Var4._M_head_impl = local_50._M_head_impl;
  pIVar2 = (statement->valueExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_50);
  local_90 = local_50._M_head_impl;
  _wrapper = (ISubtreeWrapper *)operator_new(0x10);
  local_38 = (CMoveStatement *)operator_new(0x18);
  local_40 = (CMemExpression *)operator_new(0x10);
  local_48 = (CBinopExpression *)operator_new(0x20);
  local_68._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )_Var3._M_head_impl;
  this_00 = (CBinopExpression *)operator_new(0x20);
  pCVar7 = (CBinopExpression *)operator_new(0x20);
  local_a0._M_head_impl = _Var4._M_head_impl;
  pCVar8 = (CConstExpression *)operator_new(0x10);
  IRT::CConstExpression::CConstExpression(pCVar8,1);
  local_78._M_head_impl = (CExpression *)pCVar8;
  IRT::CBinopExpression::CBinopExpression
            (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                     *)&local_a0,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_78,PLUS);
  local_98._M_head_impl = (CExpression *)pCVar7;
  pCVar8 = (CConstExpression *)operator_new(0x10);
  _value = IRT::CFrame::GetWordSize(this->currentFrame);
  IRT::CConstExpression::CConstExpression(pCVar8,_value);
  local_80._M_head_impl = (CExpression *)pCVar8;
  IRT::CBinopExpression::CBinopExpression
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_98,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_80,MULTYPLY);
  pCVar7 = local_48;
  local_70._M_head_impl = (CExpression *)this_00;
  IRT::CBinopExpression::CBinopExpression
            (local_48,&local_68,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_70,PLUS);
  pCVar5 = local_40;
  local_60._M_head_impl = &pCVar7->super_CExpression;
  IRT::CMemExpression::CMemExpression
            (local_40,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_60);
  pCVar6 = local_38;
  local_58._M_head_impl = &pCVar5->super_CExpression;
  local_88._M_head_impl = local_90;
  IRT::CMoveStatement::CMoveStatement
            (local_38,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_58,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_88);
  _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b4c8;
  _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar6;
  updateSubtreeWrapper(this,_wrapper);
  if (local_88._M_head_impl != (CExpression *)0x0) {
    (*((local_88._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_88._M_head_impl = (CExpression *)0x0;
  if ((CMemExpression *)local_58._M_head_impl != (CMemExpression *)0x0) {
    (*(((CExpression *)&(local_58._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_58._M_head_impl = (CExpression *)0x0;
  if ((CBinopExpression *)local_60._M_head_impl != (CBinopExpression *)0x0) {
    (*(((CExpression *)&(local_60._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_60._M_head_impl = (CExpression *)0x0;
  if ((CBinopExpression *)local_70._M_head_impl != (CBinopExpression *)0x0) {
    (*(((CExpression *)&(local_70._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_70._M_head_impl = (CExpression *)0x0;
  if ((CConstExpression *)local_80._M_head_impl != (CConstExpression *)0x0) {
    (*(((CExpression *)&(local_80._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_80._M_head_impl = (CExpression *)0x0;
  if ((CBinopExpression *)local_98._M_head_impl != (CBinopExpression *)0x0) {
    (*(((CExpression *)&(local_98._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_98._M_head_impl = (CExpression *)0x0;
  if ((CConstExpression *)local_78._M_head_impl != (CConstExpression *)0x0) {
    (*(((CExpression *)&(local_78._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_78._M_head_impl = (CExpression *)0x0;
  if (local_a0._M_head_impl != (CExpression *)0x0) {
    (*((local_a0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_a0._M_head_impl = (CExpression *)0x0;
  if (local_68._M_t.
      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>)0x0) {
    (**(code **)((long)*(IExpression *)
                        local_68._M_t.
                        super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl + 0x10)
    )();
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CAssignSubscriptStm &statement ) {
    std::cout << "IRT builder: CAssignSubscriptStm\n";
    statement.idExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> leftPartExpression = std::move( wrapper->ToExpression( ));

    statement.indexExpression->Accept(*this);
    std::unique_ptr<const IRT::CExpression> indexExpression = std::move( wrapper->ToExpression() );

    statement.valueExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> rightPartExpression = std::move( wrapper->ToExpression( ));


    updateSubtreeWrapper( new IRT::CStatementWrapper(
            new IRT::CMoveStatement(
                    std::move( std::unique_ptr<const IRT::CExpression>(
                            new IRT::CMemExpression(
                                    std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CBinopExpression(
                                            std::move( leftPartExpression ),
                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                    new IRT::CBinopExpression(
                                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                                    new IRT::CBinopExpression(
                                                                            std::move( indexExpression ),
                                                                            std::move(
                                                                                    std::unique_ptr<const IRT::CExpression>(
                                                                                            new IRT::CConstExpression(
                                                                                                    1 )
                                                                                    )),
                                                                            IRT::enums::TOperationType::PLUS
                                                                    ))),
                                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                                    new IRT::CConstExpression(
                                                                            currentFrame->GetWordSize( )))),
                                                            IRT::enums::TOperationType::MULTYPLY
                                                    )
                                            )),
                                            IRT::enums::TOperationType::PLUS
                                                                                        )
                                               )
                                    )))),
                    std::move( rightPartExpression )
            )
    ));

}